

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int tls_prf_generic(mbedtls_md_type_t md_type,uchar *secret,size_t slen,char *label,uchar *random,
                   size_t rlen,uchar *dstbuf,size_t dlen)

{
  byte bVar1;
  ulong ilen;
  size_t sVar2;
  ulong local_160;
  undefined1 local_148 [4];
  int ret;
  mbedtls_md_context_t md_ctx;
  mbedtls_md_info_t *md_info;
  uchar h_i [64];
  uchar tmp [128];
  size_t md_len;
  size_t k;
  size_t j;
  size_t i;
  size_t nb;
  size_t rlen_local;
  uchar *random_local;
  char *label_local;
  size_t slen_local;
  uchar *secret_local;
  mbedtls_md_type_t md_type_local;
  
  mbedtls_md_init((mbedtls_md_context_t *)local_148);
  md_ctx.hmac_ctx = mbedtls_md_info_from_type(md_type);
  if ((mbedtls_md_info_t *)md_ctx.hmac_ctx == (mbedtls_md_info_t *)0x0) {
    secret_local._4_4_ = -0x6c00;
  }
  else {
    bVar1 = mbedtls_md_get_size((mbedtls_md_info_t *)md_ctx.hmac_ctx);
    ilen = (ulong)bVar1;
    sVar2 = strlen(label);
    if (ilen + sVar2 + rlen < 0x81) {
      sVar2 = strlen(label);
      memcpy(h_i + ilen + 0x38,label,sVar2);
      memcpy(h_i + sVar2 + ilen + 0x38,random,rlen);
      secret_local._4_4_ =
           mbedtls_md_setup((mbedtls_md_context_t *)local_148,(mbedtls_md_info_t *)md_ctx.hmac_ctx,1
                           );
      if (secret_local._4_4_ == 0) {
        mbedtls_md_hmac_starts((mbedtls_md_context_t *)local_148,secret,slen);
        mbedtls_md_hmac_update((mbedtls_md_context_t *)local_148,h_i + ilen + 0x38,rlen + sVar2);
        mbedtls_md_hmac_finish((mbedtls_md_context_t *)local_148,h_i + 0x38);
        for (j = 0; j < dlen; j = ilen + j) {
          mbedtls_md_hmac_reset((mbedtls_md_context_t *)local_148);
          mbedtls_md_hmac_update((mbedtls_md_context_t *)local_148,h_i + 0x38,ilen + rlen + sVar2);
          mbedtls_md_hmac_finish((mbedtls_md_context_t *)local_148,(uchar *)&md_info);
          mbedtls_md_hmac_reset((mbedtls_md_context_t *)local_148);
          mbedtls_md_hmac_update((mbedtls_md_context_t *)local_148,h_i + 0x38,ilen);
          mbedtls_md_hmac_finish((mbedtls_md_context_t *)local_148,h_i + 0x38);
          local_160 = ilen;
          if (dlen < j + ilen) {
            local_160 = dlen % ilen;
          }
          for (k = 0; k < local_160; k = k + 1) {
            dstbuf[j + k] = h_i[k - 8];
          }
        }
        mbedtls_md_free((mbedtls_md_context_t *)local_148);
        mbedtls_zeroize(h_i + 0x38,0x80);
        mbedtls_zeroize(&md_info,0x40);
        secret_local._4_4_ = 0;
      }
    }
    else {
      secret_local._4_4_ = -0x7100;
    }
  }
  return secret_local._4_4_;
}

Assistant:

static int tls_prf_generic( mbedtls_md_type_t md_type,
                            const unsigned char *secret, size_t slen,
                            const char *label,
                            const unsigned char *random, size_t rlen,
                            unsigned char *dstbuf, size_t dlen )
{
    size_t nb;
    size_t i, j, k, md_len;
    unsigned char tmp[128];
    unsigned char h_i[MBEDTLS_MD_MAX_SIZE];
    const mbedtls_md_info_t *md_info;
    mbedtls_md_context_t md_ctx;
    int ret;

    mbedtls_md_init( &md_ctx );

    if( ( md_info = mbedtls_md_info_from_type( md_type ) ) == NULL )
        return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );

    md_len = mbedtls_md_get_size( md_info );

    if( sizeof( tmp ) < md_len + strlen( label ) + rlen )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

    nb = strlen( label );
    memcpy( tmp + md_len, label, nb );
    memcpy( tmp + md_len + nb, random, rlen );
    nb += rlen;

    /*
     * Compute P_<hash>(secret, label + random)[0..dlen]
     */
    if ( ( ret = mbedtls_md_setup( &md_ctx, md_info, 1 ) ) != 0 )
        return( ret );

    mbedtls_md_hmac_starts( &md_ctx, secret, slen );
    mbedtls_md_hmac_update( &md_ctx, tmp + md_len, nb );
    mbedtls_md_hmac_finish( &md_ctx, tmp );

    for( i = 0; i < dlen; i += md_len )
    {
        mbedtls_md_hmac_reset ( &md_ctx );
        mbedtls_md_hmac_update( &md_ctx, tmp, md_len + nb );
        mbedtls_md_hmac_finish( &md_ctx, h_i );

        mbedtls_md_hmac_reset ( &md_ctx );
        mbedtls_md_hmac_update( &md_ctx, tmp, md_len );
        mbedtls_md_hmac_finish( &md_ctx, tmp );

        k = ( i + md_len > dlen ) ? dlen % md_len : md_len;

        for( j = 0; j < k; j++ )
            dstbuf[i + j]  = h_i[j];
    }

    mbedtls_md_free( &md_ctx );

    mbedtls_zeroize( tmp, sizeof( tmp ) );
    mbedtls_zeroize( h_i, sizeof( h_i ) );

    return( 0 );
}